

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classinstance.cpp
# Opt level: O2

void __thiscall ClassInstance::ClassInstance(ClassInstance *this,ClassRuntime *classRuntime)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  u2 index;
  ClassFile *pCVar3;
  char *pcVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  Heap *this_00;
  ostream *poVar7;
  u2 *puVar8;
  ulong unaff_R12;
  ulong uVar9;
  allocator local_a1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
  *local_a0;
  ClassInstance *local_98;
  string fieldDescriptor;
  string fieldName;
  key_type local_50;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_objectType_00133d90;
  this->_classRuntime = classRuntime;
  local_a0 = &this->_fields;
  p_Var1 = &(this->_fields)._M_t._M_impl.super__Rb_tree_header;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar3 = ClassRuntime::getClassFile(classRuntime);
  local_98 = this;
  if ((pCVar3->access_flags & 0x400) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"InstantiationError");
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(1);
  }
  puVar8 = &pCVar3->fields->descriptor_index;
  uVar9 = 0;
  do {
    if (pCVar3->fields_count <= uVar9) {
      this_00 = Heap::getInstance();
      Heap::addObject(this_00,&local_98->super_Object);
      return;
    }
    if ((((field_info *)(puVar8 + -2))->access_flags & 0x18) != 0) goto LAB_00124d4b;
    index = *puVar8;
    pcVar4 = getFormattedConstant(pCVar3->constant_pool,puVar8[-1]);
    std::__cxx11::string::string((string *)&fieldName,pcVar4,(allocator *)&fieldDescriptor);
    pcVar4 = getFormattedConstant(pCVar3->constant_pool,index);
    std::__cxx11::string::string((string *)&fieldDescriptor,pcVar4,&local_a1);
    cVar2 = *fieldDescriptor._M_dataplus._M_p;
    unaff_R12 = unaff_R12 & 0xffffffff;
    switch(cVar2) {
    case 'B':
      unaff_R12 = unaff_R12 | 0x100000000;
      break;
    case 'C':
      unaff_R12 = unaff_R12 | 0x200000000;
      break;
    case 'D':
      uVar5 = 0x700000000;
      goto LAB_00124d0a;
    case 'E':
    case 'G':
    case 'H':
switchD_00124caf_caseD_45:
      uVar5 = 0x900000000;
      goto LAB_00124d0a;
    case 'F':
      uVar5 = 0x500000000;
      goto LAB_00124d0a;
    case 'I':
      unaff_R12 = unaff_R12 | 0x400000000;
      break;
    case 'J':
      uVar5 = 0x600000000;
LAB_00124d0a:
      unaff_R12 = unaff_R12 | uVar5;
      break;
    default:
      if (cVar2 == 'S') {
        uVar5 = 0x300000000;
        goto LAB_00124d0a;
      }
      if (cVar2 != 'Z') goto switchD_00124caf_caseD_45;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&fieldName);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
             ::operator[](local_a0,&local_50);
    pmVar6->printType = (int)unaff_R12;
    pmVar6->type = (int)(unaff_R12 >> 0x20);
    (pmVar6->data).longValue = 0;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&fieldDescriptor);
    std::__cxx11::string::~string((string *)&fieldName);
LAB_00124d4b:
    uVar9 = uVar9 + 1;
    puVar8 = puVar8 + 8;
  } while( true );
}

Assistant:

ClassInstance::ClassInstance(ClassRuntime *classRuntime) : _classRuntime(classRuntime) {
    ClassFile *classFile = classRuntime->getClassFile();
    field_info *fields = classFile->fields;
    u2 abstractFlag = 0x0400;
    
    if ((classFile->access_flags & abstractFlag) != 0) {
        // Não pode instanciar se for classe abstrata (i.e., interface)
        cerr << "InstantiationError" << endl;
        exit(1);
    }
    
    for (int i = 0; i < classFile->fields_count; i++) {
        field_info field = fields[i];
        u2 staticAndFinalFlag = 0x0008 | 0x0010;
        
        if ((field.access_flags & staticAndFinalFlag) == 0) { // não estática e não final
            string fieldName = getFormattedConstant(classFile->constant_pool, field.name_index);
            string fieldDescriptor = getFormattedConstant(classFile->constant_pool, field.descriptor_index);
            
            char fieldType = fieldDescriptor[0];
            Value value;
            
            switch (fieldType) {
                case 'B':
                    value.type = ValueType::BYTE;
                    value.data.byteValue = 0;
                    break;
                case 'C':
                    value.type = ValueType::CHAR;
                    value.data.charValue = 0;
                    break;
                case 'D':
                    value.type = ValueType::DOUBLE;
                    value.data.doubleValue = 0;
                    break;
                case 'F':
                    value.type = ValueType::FLOAT;
                    value.data.floatValue = 0;
                    break;
                case 'I':
                    value.type = ValueType::INT;
                    value.data.intValue = 0;
                    break;
                case 'J':
                    value.type = ValueType::LONG;
                    value.data.longValue = 0;
                    break;
                case 'S':
                    value.type = ValueType::SHORT;
                    value.data.shortValue = 0;
                    break;
                case 'Z':
                    value.type = ValueType::BOOLEAN;
                    value.data.charValue = false;
                    break;
                default:
                    value.type = ValueType::REFERENCE;
                    value.data.object = NULL;
            }
            
            putValueIntoField(value, fieldName);
        }
    }
    
    // quando um objeto é criado, ele precisa ser armazenado na Heap
    Heap &heap = Heap::getInstance();
    heap.addObject(this);
}